

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O0

void supdup_receive(Plug *plug,int urgent,char *data,size_t len)

{
  Supdup *supdup;
  size_t len_local;
  char *data_local;
  int urgent_local;
  Plug *plug_local;
  
  do_supdup_read((Supdup *)(plug + -0x12),data,len);
  return;
}

Assistant:

static void supdup_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    Supdup *supdup = container_of(plug, Supdup, plug);
    do_supdup_read(supdup, data, len);
}